

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_getopt(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *zIn_00;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  ushort **ppuVar5;
  char *zArg_00;
  int local_9c;
  int local_98;
  int need_val;
  int c;
  int nByte;
  SyBlob *pArg;
  jx9_value *pWorker;
  jx9_value *pArray;
  getopt_long_opt sLong;
  char *zArgEnd;
  char *zArgIn;
  char *zArg;
  char *zEnd;
  char *zIn;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pCtx,1,"Missing/Invalid option arguments");
    jx9_result_bool(pCtx,0);
  }
  else {
    pcVar3 = jx9_value_to_string(*apArg,&need_val);
    pcVar4 = pcVar3 + need_val;
    _c = &pCtx->pVm->sArgv;
    pWorker = jx9_context_new_array(pCtx);
    pArg = (SyBlob *)jx9_context_new_scalar(pCtx);
    if ((pWorker == (jx9_value *)0x0) || ((jx9_value *)pArg == (jx9_value *)0x0)) {
      jx9_context_throw_error(pCtx,1,"JX9 is running out of memory");
      jx9_result_bool(pCtx,0);
    }
    else if (_c->nByte == 0) {
      jx9_result_value(pCtx,pWorker);
    }
    else {
      zIn_00 = (jx9_value *)_c->pBlob;
      sLong.zArgIn = (char *)((long)&zIn_00->x + (ulong)_c->nByte);
      sLong.pWorker = pWorker;
      pArray = zIn_00;
      sLong.zArgEnd = (char *)pArg;
      sLong.pArray = (jx9_value *)pCtx;
      sLong.pCtx = (jx9_context *)sLong.zArgIn;
      while (zEnd = pcVar3, zEnd < pcVar4) {
        local_98 = (int)*zEnd;
        local_9c = 0;
        pcVar3 = zEnd + 1;
        ppuVar5 = __ctype_b_loc();
        if (((*ppuVar5)[local_98] & 8) != 0) {
          if ((pcVar3 < pcVar4) && (*pcVar3 == ':')) {
            pcVar3 = zEnd + 2;
            local_9c = 1;
            if ((pcVar3 < pcVar4) && (*pcVar3 == ':')) {
              pcVar3 = zEnd + 3;
            }
          }
          zEnd = pcVar3;
          zArg_00 = VmFindShortOpt(local_98,(char *)zIn_00,(char *)sLong.pCtx);
          pcVar3 = zEnd;
          if (zArg_00 != (char *)0x0) {
            VmExtractOptArgValue
                      (pWorker,(jx9_value *)pArg,zArg_00,(char *)sLong.pCtx,local_9c,pCtx,
                       (char *)&local_98);
          }
        }
      }
      if (((1 < nArg) && (iVar1 = jx9_value_is_json_array(apArg[1]), iVar1 != 0)) &&
         (uVar2 = jx9_array_count(apArg[1]), uVar2 != 0)) {
        jx9_array_walk(apArg[1],VmProcessLongOpt,&pArray);
      }
      jx9_result_value(pCtx,pWorker);
    }
  }
  return 0;
}

Assistant:

static int vm_builtin_getopt(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zEnd, *zArg, *zArgIn, *zArgEnd;
	struct getopt_long_opt sLong;
	jx9_value *pArray, *pWorker;
	SyBlob *pArg;
	int nByte;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Missing/Invalid option arguments");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract option arguments */
	zIn  = jx9_value_to_string(apArg[0], &nByte);
	zEnd = &zIn[nByte];
	/* Point to the string representation of the $argv[] array */
	pArg = &pCtx->pVm->sArgv;
	/* Create a new empty array and a worker variable */
	pArray = jx9_context_new_array(pCtx);
	pWorker = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pWorker == 0 ){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( SyBlobLength(pArg) < 1 ){
		/* Empty command line, return the empty array*/
		jx9_result_value(pCtx, pArray);
		/* Everything will be released automatically when we return 
		 * from this function.
		 */
		return JX9_OK;
	}
	zArgIn = (const char *)SyBlobData(pArg);
	zArgEnd = &zArgIn[SyBlobLength(pArg)];
	/* Fill the long option structure */
	sLong.pArray = pArray;
	sLong.pWorker = pWorker;
	sLong.zArgIn =  zArgIn;
	sLong.zArgEnd = zArgEnd;
	sLong.pCtx = pCtx;
	/* Start processing */
	while( zIn < zEnd ){
		int c = zIn[0];
		int need_val = 0;
		/* Advance the stream cursor */
		zIn++;
		/* Ignore non-alphanum characters */
		if( !SyisAlphaNum(c) ){
			continue;
		}
		if( zIn < zEnd && zIn[0] == ':' ){
			zIn++;
			need_val = 1;
			if( zIn < zEnd && zIn[0] == ':' ){
				zIn++;
			}
		}
		/* Find option */
		zArg = VmFindShortOpt(c, zArgIn, zArgEnd);
		if( zArg == 0 ){
			/* No such option */
			continue;
		}
		/* Extract option argument value */
		VmExtractOptArgValue(pArray, pWorker, zArg, zArgEnd, need_val, pCtx, (const char *)&c);	
	}
	if( nArg > 1 && jx9_value_is_json_array(apArg[1]) && jx9_array_count(apArg[1]) > 0 ){
		/* Process long options */
		jx9_array_walk(apArg[1], VmProcessLongOpt, &sLong);
	}
	/* Return the option array */
	jx9_result_value(pCtx, pArray);
	/* 
	 * Don't worry about freeing memory, everything will be released
	 * automatically as soon we return from this foreign function.
	 */
	return JX9_OK;
}